

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
::TestBody(InsertHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
           *this)

{
  anon_union_8_1_a8a14541_for_iterator_1 *this_00;
  iterator i;
  const_iterator cVar1;
  iterator i_00;
  const_iterator cVar2;
  bool bVar3;
  char *pcVar4;
  reference piVar5;
  char *in_R9;
  AssertHelper local_700;
  Message local_6f8;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_6c0;
  Message local_6b8;
  iterator local_6b0;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__1;
  const_iterator local_630;
  iterator local_600;
  AssertHelper local_5d0;
  Message local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_590;
  Message local_588;
  iterator local_580;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_;
  iterator local_528;
  const_iterator local_4f8;
  undefined1 auStack_4c8 [8];
  iterator it;
  TypeParam m;
  T val;
  InsertHint<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  m.
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ =
       hash_internal::Generator<int,_void>::operator()
                 ((Generator<int,_void> *)
                  ((long)&m.
                          super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                          .sets_._M_elems[0xf].set_.settings_.
                          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                  + 0x1b));
  this_00 = &it.it_end_.field_1;
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)this_00);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::end(&local_528,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
         *)this_00);
  i.inner_end_ = local_528.inner_end_;
  i.inner_ = local_528.inner_;
  i.it_.ctrl_ = local_528.it_.ctrl_;
  i.it_.field_1.slot_ = local_528.it_.field_1.slot_;
  i.it_end_.ctrl_ = local_528.it_end_.ctrl_;
  i.it_end_.field_1.slot_ = local_528.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::const_iterator::const_iterator(&local_4f8,i);
  cVar1.iter_.inner_end_ = local_4f8.iter_.inner_end_;
  cVar1.iter_.inner_ = local_4f8.iter_.inner_;
  cVar1.iter_.it_.ctrl_ = local_4f8.iter_.it_.ctrl_;
  cVar1.iter_.it_.field_1.slot_ = local_4f8.iter_.it_.field_1.slot_;
  cVar1.iter_.it_end_.ctrl_ = local_4f8.iter_.it_end_.ctrl_;
  cVar1.iter_.it_end_.field_1.slot_ = local_4f8.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::insert<int,_0,_0>((iterator *)auStack_4c8,
                      (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                       *)&it.it_end_.field_1,cVar1,
                      (int *)((long)&m.
                                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                                     .sets_._M_elems[0xf].set_.settings_.
                                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                             + 0x1c));
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::end(&local_580,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
         *)&it.it_end_.field_1);
  local_549 = priv::operator!=((iterator *)auStack_4c8,&local_580);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,&local_549,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar3) {
    testing::Message::Message(&local_588);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_548,(AssertionResult *)"it != m.end()"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_590,&local_588);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  piVar5 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
           ::iterator::operator*((iterator *)auStack_4c8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_5c0,"val","*it",
             (int *)((long)&m.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x1c),piVar5);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar3) {
    testing::Message::Message(&local_5c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_4c8;
  i_00.inner_end_ = it.inner_;
  i_00.inner_ = (Inner *)auStack_4c8;
  i_00.it_.ctrl_ = (ctrl_t *)it.inner_end_;
  i_00.it_.field_1.slot_ = (slot_type *)it.it_.ctrl_;
  i_00.it_end_.ctrl_ = (ctrl_t *)it.it_.field_1.slot_;
  i_00.it_end_.field_1.slot_ = (slot_type *)it.it_end_.ctrl_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::const_iterator::const_iterator(&local_630,i_00);
  cVar2.iter_.inner_end_ = local_630.iter_.inner_end_;
  cVar2.iter_.inner_ = local_630.iter_.inner_;
  cVar2.iter_.it_.ctrl_ = local_630.iter_.it_.ctrl_;
  cVar2.iter_.it_.field_1.slot_ = local_630.iter_.it_.field_1.slot_;
  cVar2.iter_.it_end_.ctrl_ = local_630.iter_.it_end_.ctrl_;
  cVar2.iter_.it_end_.field_1.slot_ = local_630.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::insert<int,_0,_0>(&local_600,
                      (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                       *)&it.it_end_.field_1,cVar2,
                      (int *)((long)&m.
                                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                                     .sets_._M_elems[0xf].set_.settings_.
                                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                             + 0x1c));
  it.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_600.it_end_.ctrl_;
  it.it_end_.ctrl_ = (ctrl_t *)local_600.it_end_.field_1.slot_;
  it.inner_end_ = (Inner *)local_600.it_.ctrl_;
  it.it_.ctrl_ = (ctrl_t *)local_600.it_.field_1.slot_;
  auStack_4c8 = (undefined1  [8])local_600.inner_;
  it.inner_ = local_600.inner_end_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::end(&local_6b0,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
         *)&it.it_end_.field_1);
  local_679 = priv::operator!=((iterator *)auStack_4c8,&local_6b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_678,&local_679,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar3) {
    testing::Message::Message(&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_678,
               (AssertionResult *)"it != m.end()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  piVar5 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
           ::iterator::operator*((iterator *)auStack_4c8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_6f0,"val","*it",
             (int *)((long)&m.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x1c),piVar5);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar3) {
    testing::Message::Message(&local_6f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_700,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x3f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper(&local_700);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)&it.it_end_.field_1);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  it = m.insert(it, val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}